

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

short __thiscall QLocale::toShort(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  QSimpleParsedNumber<long_long> QVar5;
  
  pQVar1 = (this->d).d.ptr;
  QVar5 = QLocaleData::stringToLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  sVar2 = (short)QVar5.result;
  if (ok == (bool *)0x0) {
    bVar4 = (long)sVar2 == QVar5.result;
  }
  else {
    bVar4 = (long)sVar2 == QVar5.result;
    *ok = 0 < QVar5.used && bVar4;
  }
  sVar3 = 0;
  if (bVar4) {
    sVar3 = sVar2;
  }
  return sVar3;
}

Assistant:

short QLocale::toShort(QStringView s, bool *ok) const
{
    return toIntegral_helper<short>(d, s, ok);
}